

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::GetBbrDataset
          (CommissionerImpl *this,Handler<BbrDataset> *aHandler,uint16_t aDatasetFlags)

{
  bool bVar1;
  uint uVar2;
  Error *pEVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  Error local_520;
  ErrorCode local_4f8;
  anon_class_1_0_00000001 local_4f2;
  v10 local_4f1;
  v10 *local_4f0;
  size_t local_4e8;
  string local_4e0;
  allocator local_4b9;
  string local_4b8;
  ResponseHandler local_498;
  ErrorCode local_474;
  Tlv local_470;
  Error local_450;
  ErrorCode local_428;
  allocator local_421;
  string local_420;
  Error local_400;
  anon_class_1_0_00000001 local_3d2;
  v10 local_3d1;
  v10 *local_3d0;
  size_t local_3c8;
  string local_3c0;
  Error local_3a0;
  anon_class_1_0_00000001 local_372;
  v10 local_371;
  v10 *local_370;
  size_t local_368;
  string local_360;
  Error local_340;
  undefined1 local_318 [8];
  anon_class_32_1_d0c21527 onResponse;
  ByteArray datasetList;
  undefined1 local_2d0 [8];
  Request request;
  Error error;
  uint16_t aDatasetFlags_local;
  Handler<BbrDataset> *aHandler_local;
  CommissionerImpl *this_local;
  undefined1 local_1f0 [16];
  v10 *local_1e0;
  ulong local_1d8;
  v10 *local_1d0;
  size_t sStack_1c8;
  string *local_1c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1b8 [3];
  undefined1 local_1a0 [16];
  v10 *local_190;
  ulong local_188;
  v10 *local_180;
  size_t sStack_178;
  string *local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_168 [2];
  undefined1 local_158 [16];
  v10 *local_148;
  ulong local_140;
  v10 *local_138;
  size_t sStack_130;
  string *local_128;
  v10 *local_120;
  v10 **local_118;
  v10 *local_110;
  v10 **local_108;
  v10 *local_100;
  v10 **local_f8;
  v10 **local_f0;
  v10 *local_e8;
  size_t sStack_e0;
  v10 **local_d0;
  v10 *local_c8;
  size_t sStack_c0;
  v10 **local_b0;
  v10 *local_a8;
  size_t sStack_a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_98;
  undefined1 *local_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_88;
  undefined8 local_80;
  undefined1 *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_70;
  undefined1 *local_68;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_60;
  undefined8 local_58;
  undefined1 *local_50;
  CommissionerImpl **local_48;
  undefined1 *local_40;
  CommissionerImpl **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  CommissionerImpl **local_20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_10;
  
  Error::Error((Error *)&request.mEndpoint);
  coap::Message::Message((Message *)local_2d0,kConfirmable,kPost);
  GetBbrDatasetTlvs((ByteArray *)&onResponse.aHandler._M_invoker,aDatasetFlags);
  std::function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)>::function
            ((function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)> *)
             local_318,aHandler);
  uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
  if ((uVar2 & 1) == 0) {
    GetBbrDataset::anon_class_1_0_00000001::operator()(&local_372);
    local_118 = &local_370;
    local_120 = &local_371;
    bVar4 = ::fmt::v10::operator()(local_120);
    local_368 = bVar4.size_;
    local_370 = (v10 *)bVar4.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_128 = &local_360;
    local_138 = local_370;
    sStack_130 = local_368;
    local_f0 = &local_138;
    local_148 = local_370;
    local_140 = local_368;
    local_e8 = local_148;
    sStack_e0 = local_140;
    local_168[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_90 = local_158;
    local_98 = local_168;
    local_80 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_98;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_140;
    local_88 = local_98;
    local_78 = local_90;
    local_10 = local_98;
    ::fmt::v10::vformat_abi_cxx11_(&local_360,local_148,fmt,args);
    Error::Error(&local_340,kInvalidState,&local_360);
    Error::operator=((Error *)&request.mEndpoint,&local_340);
    Error::~Error(&local_340);
    std::__cxx11::string::~string((string *)&local_360);
  }
  else {
    uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
    if ((uVar2 & 1) == 0) {
      GetBbrDataset::anon_class_1_0_00000001::operator()(&local_3d2);
      local_108 = &local_3d0;
      local_110 = &local_3d1;
      bVar4 = ::fmt::v10::operator()(local_110);
      local_3c8 = bVar4.size_;
      local_3d0 = (v10 *)bVar4.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_170 = &local_3c0;
      local_180 = local_3d0;
      sStack_178 = local_3c8;
      local_d0 = &local_180;
      local_190 = local_3d0;
      local_188 = local_3c8;
      local_c8 = local_190;
      sStack_c0 = local_188;
      local_1b8[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_68 = local_1a0;
      local_70 = local_1b8;
      local_58 = 0;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_70;
      fmt_00.size_ = 0;
      fmt_00.data_ = (char *)local_188;
      local_60 = local_70;
      local_50 = local_68;
      local_18 = local_70;
      ::fmt::v10::vformat_abi_cxx11_(&local_3c0,local_190,fmt_00,args_00);
      Error::Error(&local_3a0,kInvalidState,&local_3c0);
      Error::operator=((Error *)&request.mEndpoint,&local_3a0);
      Error::~Error(&local_3a0);
      std::__cxx11::string::~string((string *)&local_3c0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_420,"/c/bg",&local_421);
      coap::Message::SetUriPath(&local_400,(Message *)local_2d0,&local_420);
      pEVar3 = Error::operator=((Error *)&request.mEndpoint,&local_400);
      local_428 = kNone;
      bVar1 = commissioner::operator!=(pEVar3,&local_428);
      Error::~Error(&local_400);
      std::__cxx11::string::~string((string *)&local_420);
      std::allocator<char>::~allocator((allocator<char> *)&local_421);
      if (!bVar1) {
        bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &onResponse.aHandler._M_invoker);
        if (!bVar1) {
          tlv::Tlv::Tlv(&local_470,kGet,(ByteArray *)&onResponse.aHandler._M_invoker,kMeshCoP);
          AppendTlv(&local_450,(Message *)local_2d0,&local_470);
          pEVar3 = Error::operator=((Error *)&request.mEndpoint,&local_450);
          local_474 = kNone;
          bVar1 = commissioner::operator!=(pEVar3,&local_474);
          Error::~Error(&local_450);
          tlv::Tlv::~Tlv(&local_470);
          if (bVar1) goto LAB_001b969a;
        }
        std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
        function<ot::commissioner::CommissionerImpl::GetBbrDataset(std::function<void(ot::commissioner::BbrDataset_const*,ot::commissioner::Error)>,unsigned_short)::__0&,void>
                  ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)> *
                   )&local_498,(anon_class_32_1_d0c21527 *)local_318);
        ProxyClient::SendRequest(&this->mProxyClient,(Request *)local_2d0,&local_498,0xfc00,0xf0bf);
        std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
        ~function(&local_498);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_4b8,"mgmt",&local_4b9);
        GetBbrDataset::anon_class_1_0_00000001::operator()(&local_4f2);
        local_f8 = &local_4f0;
        local_100 = &local_4f1;
        bVar4 = ::fmt::v10::operator()(local_100);
        local_4e8 = bVar4.size_;
        local_4f0 = (v10 *)bVar4.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_1c0 = &local_4e0;
        local_1d0 = local_4f0;
        sStack_1c8 = local_4e8;
        local_b0 = &local_1d0;
        local_1e0 = local_4f0;
        local_1d8 = local_4e8;
        local_a8 = local_1e0;
        sStack_a0 = local_1d8;
        this_local = (CommissionerImpl *)
                     ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_40 = local_1f0;
        local_48 = &this_local;
        local_30 = 0;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)local_48;
        fmt_01.size_ = 0;
        fmt_01.data_ = (char *)local_1d8;
        local_38 = local_48;
        local_28 = local_40;
        local_20 = local_48;
        ::fmt::v10::vformat_abi_cxx11_(&local_4e0,local_1e0,fmt_01,args_01);
        Log(kDebug,&local_4b8,&local_4e0);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::__cxx11::string::~string((string *)&local_4b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
      }
    }
  }
LAB_001b969a:
  local_4f8 = kNone;
  bVar1 = commissioner::operator!=((Error *)&request.mEndpoint,&local_4f8);
  if (bVar1) {
    Error::Error(&local_520,(Error *)&request.mEndpoint);
    std::function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)>::operator()
              (aHandler,(BbrDataset *)0x0,&local_520);
    Error::~Error(&local_520);
  }
  GetBbrDataset(std::function<void(ot::commissioner::BbrDataset_const*,ot::commissioner::Error)>,unsigned_short)
  ::$_0::~__0((__0 *)local_318);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &onResponse.aHandler._M_invoker);
  coap::Message::~Message((Message *)local_2d0);
  Error::~Error((Error *)&request.mEndpoint);
  return;
}

Assistant:

void CommissionerImpl::GetBbrDataset(Handler<BbrDataset> aHandler, uint16_t aDatasetFlags)
{
    Error error;

    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};
    ByteArray     datasetList = GetBbrDatasetTlvs(aDatasetFlags);

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error      error;
        BbrDataset dataset;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

        SuccessOrExit(error = DecodeBbrDataset(dataset, *aResponse));

        aHandler(&dataset, error);

    exit:
        if (error != ErrorCode::kNone)
        {
            aHandler(nullptr, error);
        }
    };

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    VerifyOrExit(IsCcmMode(), error = ERROR_INVALID_STATE("sending MGMT_BBR_GET.req is only valid in CCM mode"));

    SuccessOrExit(error = request.SetUriPath(uri::kMgmtBbrGet));

    if (!datasetList.empty())
    {
        SuccessOrExit(error = AppendTlv(request, {tlv::Type::kGet, datasetList}));
    }

    mProxyClient.SendRequest(request, onResponse, kLeaderAloc16, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_BBR_GET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}